

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall Potassco::Application::processSignal(Application *this,int sig)

{
  long lVar1;
  ulong uVar2;
  int in_ESI;
  long *in_RDI;
  
  lVar1 = fetch_and_inc(in_RDI + 3);
  if (lVar1 == 0) {
    uVar2 = (**(code **)(*in_RDI + 0x90))(in_RDI,in_ESI);
    if ((uVar2 & 1) == 0) {
      return;
    }
  }
  else if (in_RDI[4] == 0) {
    (**(code **)(*in_RDI + 0x38))(in_RDI,"Queueing signal...");
    in_RDI[4] = (long)in_ESI;
  }
  fetch_and_dec(in_RDI + 3);
  return;
}

Assistant:

void Application::processSignal(int sig) {
	if (fetch_and_inc(blocked_) == 0) {
		if (!onSignal(sig)) { return; } // block further signals
	}
	else if (pending_ == 0) { // signals are currently blocked because output is active
		info("Queueing signal...");
		pending_ = sig;
	}
	fetch_and_dec(blocked_);
}